

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx::create_pipeline_int8_x86(Convolution_x86_avx *this,Option *opt)

{
  Mat *this_00;
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint _c;
  _func_int *p_Var13;
  undefined1 auVar14 [16];
  size_t sVar15;
  void *pvVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  uint *puVar20;
  int iVar21;
  void *pvVar22;
  undefined4 uVar23;
  int iVar24;
  ulong uVar25;
  int k;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  int i_1;
  int iVar31;
  ulong uVar32;
  int local_168;
  undefined8 local_110;
  Mat weight_data_r2;
  Mat g0;
  Mat local_78;
  
  p_Var13 = this->_vptr_Convolution_x86_avx[-3];
  _c = *(uint *)(p_Var13 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
  uVar28 = *(int *)(p_Var13 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) *
           *(int *)(p_Var13 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
  uVar18 = (long)((ulong)(uint)((int)((long)*(int *)(p_Var13 + 0x14 +
                                                    (long)&(this->weight_data_int8).data) /
                                     (long)(int)uVar28) >> 0x1f) << 0x20 |
                 (long)*(int *)(p_Var13 + 0x14 + (long)&(this->weight_data_int8).data) /
                 (long)(int)uVar28 & 0xffffffffU) / (long)(int)_c;
  if (opt->use_packing_layout == true) {
    uVar26 = 1;
    if ((uVar18 & 7) == 0) {
      uVar26 = 8;
    }
    uVar25 = (ulong)((uint)((_c & 3) == 0) * 3 + 1);
  }
  else {
    uVar26 = 1;
    uVar25 = 1;
  }
  iVar31 = (int)uVar26;
  iVar21 = (int)uVar18;
  local_168 = (int)uVar25;
  if ((iVar31 == 1) && (local_168 == 1)) {
    if ((((*(int *)(p_Var13 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3) &&
         (*(int *)(p_Var13 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
        ((opt->use_winograd_convolution != false &&
         ((((*(int *)(p_Var13 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)(p_Var13 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(int *)(p_Var13 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
          ((0xf < (int)_c && (*(int *)((long)&this->convolution_dilation1 + (long)p_Var13) == 1)))))
         ))) && (0xf < iVar21)) {
      Mat::create(&this->weight_data_3x3_winograd23_int8,0x10,iVar21,_c,2,(Allocator *)0x0);
      for (uVar26 = 0; uVar26 != _c; uVar26 = uVar26 + 1) {
        for (uVar25 = 0; uVar25 != (uVar18 & 0xffffffff); uVar25 = uVar25 + 1) {
          lVar29 = *(long *)(p_Var13 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data) +
                   (long)(iVar21 * 9 * (int)uVar26);
          lVar30 = uVar25 * 9;
          Mat::channel(&weight_data_r2,&this->weight_data_3x3_winograd23_int8,(int)uVar26);
          sVar15 = weight_data_r2.elemsize;
          pvVar22 = weight_data_r2.data;
          lVar17 = (long)weight_data_r2.w;
          Mat::~Mat(&weight_data_r2);
          cVar1 = *(char *)(lVar29 + lVar30);
          cVar2 = *(char *)(lVar29 + 1 + lVar30);
          cVar3 = *(char *)(lVar29 + 2 + lVar30);
          cVar4 = *(char *)(lVar29 + 3 + lVar30);
          cVar5 = *(char *)(lVar29 + 4 + lVar30);
          cVar6 = *(char *)(lVar29 + 5 + lVar30);
          cVar7 = *(char *)(lVar29 + 6 + lVar30);
          cVar8 = *(char *)(lVar29 + 7 + lVar30);
          cVar9 = *(char *)(lVar29 + 8 + lVar30);
          for (lVar30 = 4; lVar30 != 0x1c; lVar30 = lVar30 + 6) {
            sVar10 = *(short *)(&UNK_002d993c + lVar30);
            sVar11 = *(short *)(&UNK_002d993e + lVar30);
            sVar12 = *(short *)((long)&DAT_002d9940 + lVar30);
            *(short *)((long)&local_110 + lVar30 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_110 + lVar30 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)&weight_data_r2.data + lVar30) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
          }
          pvVar22 = (void *)((long)pvVar22 + sVar15 * uVar25 * lVar17);
          for (lVar30 = 0; lVar30 != 4; lVar30 = lVar30 + 1) {
            sVar10 = *(short *)((long)&weight_data_r2.data + lVar30 * 6);
            uVar28 = *(uint *)((long)&weight_data_r2.data + lVar30 * 6 + 2);
            puVar20 = &DAT_002d9942;
            for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
              auVar14 = vpmullw_avx(ZEXT416(*puVar20),ZEXT416(uVar28));
              uVar23 = vpextrw_avx(auVar14,1);
              *(short *)((long)pvVar22 + lVar17 * 2) =
                   (short)uVar23 + auVar14._0_2_ + *(short *)((long)puVar20 + -2) * sVar10;
              puVar20 = (uint *)((long)puVar20 + 6);
            }
            pvVar22 = (void *)((long)pvVar22 + 8);
          }
        }
      }
    }
  }
  else {
    Mat::reshape(&weight_data_r2,
                 (Mat *)(p_Var13 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data),
                 uVar28,iVar21,_c,(Allocator *)0x0);
    this_00 = &this->weight_data_int8;
    Mat::create(this_00,uVar28,
                (int)((long)((ulong)(uint)(iVar21 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                     (long)iVar31),
                *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                        (long)&(this->weight_data_3x3_winograd63).data) / local_168,
                (ulong)(uint)(local_168 * iVar31),local_168 * iVar31,(Allocator *)0x0);
    if ((int)uVar28 < 1) {
      uVar28 = 0;
    }
    uVar27 = 0;
    local_110 = uVar18 & 0xffffffff;
    while (uVar18 = local_110, iVar24 = (int)uVar27,
          local_168 + -1 + iVar24 <
          *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                  (long)&(this->weight_data_3x3_winograd63).data)) {
      Mat::channel(&g0,this_00,(int)(uVar27 / uVar25));
      for (uVar18 = 0; (long)uVar18 < (long)((long)iVar21 - (ulong)(iVar31 - 1));
          uVar18 = uVar18 + uVar26) {
        pvVar22 = (void *)(((uVar18 & 0xffffffff) / uVar26) * (long)g0.w * g0.elemsize +
                          (long)g0.data);
        for (uVar27 = 0; uVar27 != uVar28; uVar27 = uVar27 + 1) {
          for (iVar19 = 0; iVar19 != local_168; iVar19 = iVar19 + 1) {
            for (uVar32 = 0; uVar26 != uVar32; uVar32 = uVar32 + 1) {
              Mat::channel(&local_78,&weight_data_r2,iVar19 + iVar24);
              pvVar16 = local_78.data;
              lVar30 = (long)local_78.w * (uVar18 + uVar32) * local_78.elemsize;
              Mat::~Mat(&local_78);
              *(undefined1 *)((long)pvVar22 + uVar32) =
                   *(undefined1 *)((long)pvVar16 + uVar27 + lVar30);
            }
            pvVar22 = (void *)((long)pvVar22 + uVar32);
          }
        }
      }
      Mat::~Mat(&g0);
      uVar27 = (ulong)(uint)(iVar24 + local_168);
    }
    Mat::~Mat(&weight_data_r2);
    if ((iVar31 == 8) && (local_168 == 4)) {
      p_Var13 = this->_vptr_Convolution_x86_avx[-3];
      iVar21 = *(int *)(p_Var13 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if (((iVar21 == 1) &&
          (*(int *)(p_Var13 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
         (((((*(int *)(p_Var13 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
             (*(int *)(p_Var13 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(int *)(p_Var13 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(int *)((long)&this->convolution_dilation1 + (long)p_Var13) == 1)) ||
          (((*(int *)(p_Var13 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)(p_Var13 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           ((*(int *)(p_Var13 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 2 &&
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var13) == 2)))))))) {
        iVar31 = *(int *)(p_Var13 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar21 = 1;
        iVar24 = iVar21;
      }
      else {
        if (opt->use_sgemm_convolution != true) {
          return 0;
        }
        iVar31 = *(int *)(p_Var13 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar24 = *(int *)(p_Var13 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      }
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var13 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data),
                 this_00,(int)uVar18,iVar31,iVar21,iVar24);
    }
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_data_3x3_winograd23_int8, num_input, num_output, opt);
            //         conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_data_3x3_winograd23_int8, num_input, num_output, opt);
        }
        else
        {
            // TODO offline transform weight
        }

        return 0;
    }

    // src = kw-kh-inch-outch
    // dst = pa-pb-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_int8.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_int8.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                signed char* g00 = g0.row<signed char>(p / elempack);

                for (int k = 0; k < maxk; k++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const signed char* k00 = weight_data_r2.channel(q + j).row<const signed char>(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
    }
#endif // __SSE2__

    return 0;
}